

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O1

void get_max_cover_static2<64ul,10>
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *_end,bool print_progress)

{
  pointer puVar1;
  pointer puVar2;
  pointer paVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  size_t j;
  array<unsigned_long,_10UL> *collection;
  pointer paVar7;
  size_t N;
  size_type n;
  size_t progress;
  size_t this_count;
  vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> binary_sets;
  collection end;
  collection indices;
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>_>
  local_168;
  ulong local_148;
  size_type local_140;
  size_type local_138;
  unsigned_long local_130;
  size_t local_128;
  vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> local_120;
  anon_class_56_7_64ceefa5 local_108;
  collection local_d0;
  collection local_80;
  
  BitSetsFromSets<64ul>(&local_120,sets,names);
  local_140 = ((long)(sets->
                     super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(sets->
                     super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_148 = 1;
  lVar6 = 0;
  do {
    local_148 = local_148 * (local_140 + lVar6);
    lVar6 = lVar6 + -1;
  } while (lVar6 != -10);
  uVar5 = 1;
  do {
    local_148 = local_148 / uVar5;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xb);
  puVar1 = (_begin->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (_end->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    local_80._M_elems[lVar6] = puVar1[lVar6];
    local_d0._M_elems[lVar6] = puVar2[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  local_168.first = 0;
  local_168.second.
  super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.second.
  super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.second.
  super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.this_count = &local_128;
  local_128 = 0;
  local_108.progress = &local_130;
  local_130 = 0;
  local_108.indices = &local_80;
  local_108.end = &local_d0;
  local_108.best = &local_168;
  local_108.n = &local_140;
  local_138 = (names->_M_h)._M_element_count;
  local_108.binary_sets = &local_120;
  ProgressIndicator<std::exception,get_max_cover_static2<64ul,10>(std::vector<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>const&,std::unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool)::_lambda()_1_,unsigned_long&,unsigned_long,unsigned_long&,unsigned_long_const&>
            ("\r%zu/%zu @ %zu/%zu",print_progress,&local_108,&(local_108.best)->first,&local_138,
             local_108.progress,&local_148);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_108.indices._0_1_ = 0x2f;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_108,1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar3 = local_168.second.
           super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_168.second.
      super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_168.second.
      super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar7 = local_168.second.
             super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar6 = 1;
      do {
        local_108.indices._0_1_ = 9;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_108,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
      local_108.indices._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_108,1)
      ;
      paVar7 = paVar7 + 1;
    } while (paVar7 != paVar3);
  }
  if (local_168.second.
      super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.second.
                    super__Vector_base<std::array<unsigned_long,_10UL>,_std::allocator<std::array<unsigned_long,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_120.super__Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void get_max_cover_static2(const std::vector<Set>& sets, const std::unordered_map<std::string, size_t>& names,
    const std::vector<size_t>& _begin, const std::vector<size_t>& _end, bool print_progress = false)
{
    const std::vector<std::bitset<n_entities>> binary_sets = BitSetsFromSets<n_entities>(sets, names);
    const auto n = sets.size();
    const auto N = nchoosek(n, k);
    
    typedef std::array<size_t, k> collection;
    
    collection indices, end;

    for (size_t i = 0; i < k; ++i)
    {
        indices[i] = _begin[i];
        end[i] = _end[i];
    }

    std::pair<size_t, std::vector<collection>> best;
    best.first = 0; best.second.clear();
    size_t this_count = 0;
    size_t progress = 0;
    ProgressIndicator("\r%zu/%zu @ %zu/%zu", print_progress, [&]()
    {
        int i;
        int b = 0; // first index where 'indices' and 'end' differ
        for (; b < k; ++b)
            if (indices[b] != end[b])
                break;

        // https://docs.python.org/2/library/itertools.html#itertools.combinations
        while (running && b < k)
        {
            //for (auto x : indices)
            //    std::cerr << x << '\t';
            //std::cerr << std::endl;

            this_count = sets_union(binary_sets, indices);
            if (this_count > best.first)
            {
                best.second.clear();
                best.second.push_back(indices);
                best.first = this_count;
            }
            else if (this_count == best.first)
            {
                best.second.push_back(indices);
            }
            ++progress;

            for (i = k - 1; i >= b; --i)
                if (indices[i] != (i + n) - k)
                    break;

            if (i < b)
                break;

            indices[i] += 1;
            for (size_t j = i + 1; j < k; ++j)
                indices[j] = indices[j - 1] + 1;
            if (i == b) // recalculates place of first differ
                for (; b < k; ++b)
                    if (indices[b] != end[b])
                        break;
        }
    }, best.first, names.size(), progress, N);
    
    std::cout << best.first << '/' << names.size() << std::endl;
    for (const auto& collection : best.second)
    {
        std::cout << collection[0];
        for (size_t j = 1; j < k; ++j)
        {
            std::cout << '\t' << collection[j];
        }
        std::cout << '\n';
    }
}